

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesForm.cxx
# Opt level: O2

void cmCursesForm::LogMessage(char *msg)

{
  ostream *poVar1;
  
  if (Debug) {
    poVar1 = std::operator<<(&DebugFile.super_basic_ostream<char,_std::char_traits<char>_>,msg);
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void cmCursesForm::LogMessage(const char* msg)
{
  if (!cmCursesForm::Debug)
    {
    return;
    }

  cmCursesForm::DebugFile << msg << std::endl;
}